

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ErrorWithMsg(sqlite3 *db,int err_code,char *zFormat,...)

{
  long lVar1;
  sqlite3_value *psVar2;
  sqlite3_value *in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  sqlite3 *in_R8;
  long in_FS_OFFSET;
  char *z;
  va_list ap;
  int in_stack_ffffffffffffff0c;
  u8 enc;
  sqlite3 *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDI + 0x50) = in_ESI;
  sqlite3SystemError(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (in_RDX == 0) {
    sqlite3Error(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  else {
    if (*(long *)(in_RDI + 0x188) == 0) {
      psVar2 = sqlite3ValueNew(in_stack_ffffffffffffff10);
      *(sqlite3_value **)(in_RDI + 0x188) = psVar2;
      if (psVar2 == (sqlite3_value *)0x0) goto LAB_0013b4f8;
    }
    enc = (u8)((uint)in_stack_ffffffffffffff0c >> 0x18);
    sqlite3VMPrintf(in_R8,(char *)in_RCX,
                    (__va_list_tag *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    sqlite3ValueSetStr(in_RCX,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,enc,
                       (_func_void_void_ptr *)0x13b4f6);
  }
LAB_0013b4f8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorWithMsg(sqlite3 *db, int err_code, const char *zFormat, ...){
  assert( db!=0 );
  db->errCode = err_code;
  sqlite3SystemError(db, err_code);
  if( zFormat==0 ){
    sqlite3Error(db, err_code);
  }else if( db->pErr || (db->pErr = sqlite3ValueNew(db))!=0 ){
    char *z;
    va_list ap;
    va_start(ap, zFormat);
    z = sqlite3VMPrintf(db, zFormat, ap);
    va_end(ap);
    sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
  }
}